

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::scalarString(Input *this,StringRef *S,QuotingType param_2)

{
  HNode *hnode;
  Node *pNVar1;
  Twine local_38;
  
  hnode = this->CurrentNode;
  if (hnode != (HNode *)0x0) {
    if (hnode->_node->TypeID - 3 < 0xfffffffe) {
      Twine::Twine(&local_38,"unexpected scalar");
      setError(this,hnode,&local_38);
    }
    else {
      pNVar1 = hnode[1]._node;
      S->Data = (char *)hnode[1]._vptr_HNode;
      S->Length = (size_t)pNVar1;
    }
    return;
  }
  __assert_fail("Val && \"isa<> used on a null pointer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                ,0x69,
                "static bool llvm::isa_impl_cl<llvm::yaml::Input::ScalarHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::ScalarHNode, From = const llvm::yaml::Input::HNode *]"
               );
}

Assistant:

void Input::scalarString(StringRef &S, QuotingType) {
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    S = SN->value();
  } else {
    setError(CurrentNode, "unexpected scalar");
  }
}